

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetSigningProvider
          (DescriptorScriptPubKeyMan *this,CScript *script,bool include_private)

{
  const_iterator cVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock68;
  unique_lock<std::recursive_mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,
             (AnnotatedMixin<std::recursive_mutex> *)
             ((long)&script[0x12].super_CScriptBase._union + 0x10),"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x970,false);
  cVar1 = std::
          _Rb_tree<CScript,_std::pair<const_CScript,_int>,_std::_Select1st<std::pair<const_CScript,_int>_>,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
          ::find((_Rb_tree<CScript,_std::pair<const_CScript,_int>,_std::_Select1st<std::pair<const_CScript,_int>_>,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
                  *)((long)&script[2].super_CScriptBase._union + 0x18),
                 (key_type *)CONCAT71(in_register_00000011,include_private));
  if (cVar1._M_node == (_Base_ptr)(script + 3)) {
    (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
  }
  else {
    GetSigningProvider(this,(int32_t)script,SUB41(cVar1._M_node[2]._M_color,0));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
            )(__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<FlatSigningProvider> DescriptorScriptPubKeyMan::GetSigningProvider(const CScript& script, bool include_private) const
{
    LOCK(cs_desc_man);

    // Find the index of the script
    auto it = m_map_script_pub_keys.find(script);
    if (it == m_map_script_pub_keys.end()) {
        return nullptr;
    }
    int32_t index = it->second;

    return GetSigningProvider(index, include_private);
}